

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

float ComputeDistanceAttenuation(float normalizedDistance,F3DAUDIO_DISTANCE_CURVE *pCurve)

{
  uint uVar1;
  F3DAUDIO_DISTANCE_CURVE_POINT *pFVar2;
  bool bVar3;
  float fVar4;
  F3DAUDIO_DISTANCE_CURVE_POINT *points;
  size_t i;
  uint32_t n_points;
  float alpha;
  float res;
  F3DAUDIO_DISTANCE_CURVE *pCurve_local;
  float normalizedDistance_local;
  
  if (pCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
    res = 1.0;
    if (1.0 <= normalizedDistance) {
      res = 1.0 / normalizedDistance;
    }
  }
  else {
    pFVar2 = pCurve->pPoints;
    uVar1 = pCurve->PointCount;
    i = 1;
    while( true ) {
      bVar3 = false;
      if (i < uVar1) {
        bVar3 = pFVar2[i].Distance <= normalizedDistance;
      }
      if (!bVar3) break;
      i = i + 1;
    }
    if (i == uVar1) {
      res = pFVar2[uVar1 - 1].DSPSetting;
    }
    else {
      fVar4 = (pFVar2[i].Distance - normalizedDistance) /
              (pFVar2[i].Distance - pFVar2[i - 1].Distance);
      res = (1.0 - fVar4) * pFVar2[i].DSPSetting + fVar4 * pFVar2[i - 1].DSPSetting;
    }
  }
  return res;
}

Assistant:

static inline float ComputeDistanceAttenuation(
	float normalizedDistance,
	F3DAUDIO_DISTANCE_CURVE *pCurve
) {
	float res;
	float alpha;
	uint32_t n_points;
	size_t i;
	if (pCurve)
	{
		F3DAUDIO_DISTANCE_CURVE_POINT* points = pCurve->pPoints;
		n_points = pCurve->PointCount;

		/* By definition, the first point in the curve must be 0.0f
		 * -Adrien
		 */

		/* We advance i up until our normalizedDistance lies between the distances of
		 * the i_th and (i-1)_th points, or we reach the last point.
		 */
		for (i = 1; (i < n_points) && (normalizedDistance >= points[i].Distance); i += 1);
		if (i == n_points)
		{
			/* We've reached the last point, so we use its value directly.
			 * Quote X3DAUDIO docs:
			 * "If an emitter moves beyond a distance of (CurveDistanceScaler × 1.0f),
			 * the last point on the curve is used to compute the volume output level."
			 */
			res = points[n_points - 1].DSPSetting;
		}
		else
		{
			/* We're between two points: the distance attenuation is the linear interpolation of the DSPSetting
			 * values defined by our points, according to the distance.
			 */
			alpha = (points[i].Distance - normalizedDistance) / (points[i].Distance - points[i - 1].Distance);
			res = LERP(alpha, points[i].DSPSetting, points[i - 1].DSPSetting);
		}
	}
	else
	{
		res = 1.0f;
		if (normalizedDistance >= 1.0f)
		{
			res /= normalizedDistance;
		}
	}
	return res;
}